

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O3

void __thiscall
ddd::DaTrie<true,_false,_false>::unfix_
          (DaTrie<true,_false,_false> *this,uint32_t node_pos,
          vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *blocks)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  pointer pBVar4;
  pointer pBVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  
  uVar8 = node_pos >> 8;
  pBVar4 = (blocks->super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (*(int *)((long)&pBVar4->num_emps + (ulong)(uVar8 << 4)) == 0) {
    pBVar5 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar5[node_pos] =
         (Bc)((ulong)pBVar5[node_pos] & 0xffffffff00000000 | (ulong)(node_pos & 0x7fffffff));
    pBVar5 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar5[node_pos] =
         (Bc)((ulong)pBVar5[node_pos] & 0x80000000ffffffff | (ulong)(node_pos & 0x7fffffff) << 0x20)
    ;
    pBVar4 = (blocks->super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar1 = (uint *)((long)&pBVar4->next + (ulong)(uVar8 << 4));
    *(uint32_t *)((long)&pBVar4->head + (ulong)(uVar8 << 4)) = node_pos;
    uVar2 = this->head_pos_;
    uVar7 = (ulong)uVar2;
    if (uVar7 == 0xffffffff) {
      *puVar1 = uVar8;
      puVar1[1] = uVar8;
      this->head_pos_ = uVar8;
    }
    else {
      uVar3 = pBVar4[uVar7].prev;
      puVar1[1] = uVar3;
      *puVar1 = uVar2;
      pBVar4[uVar3].next = uVar8;
      pBVar4[uVar7].prev = uVar8;
    }
  }
  else {
    uVar2 = *(uint *)((long)&pBVar4->head + (ulong)(uVar8 << 4));
    pBVar5 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar5[node_pos] =
         (Bc)((ulong)pBVar5[node_pos] & 0x80000000ffffffff |
             (ulong)pBVar5[uVar2] & 0x7fffffff00000000);
    pBVar5 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar5[node_pos] =
         (Bc)((ulong)(uVar2 & 0x7fffffff) | (ulong)pBVar5[node_pos] & 0xffffffff00000000);
    pBVar5 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = (ulong)pBVar5[uVar2] >> 0x1d & 0x3fffffff8;
    *(ulong *)(&pBVar5->field_0x0 + uVar7) =
         *(ulong *)(&pBVar5->field_0x0 + uVar7) & 0xffffffff00000000 |
         (ulong)(node_pos & 0x7fffffff);
    pBVar5 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar5[uVar2] =
         (Bc)((ulong)pBVar5[uVar2] & 0x80000000ffffffff | (ulong)(node_pos & 0x7fffffff) << 0x20);
  }
  pBVar5 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start + node_pos;
  *pBVar5 = (Bc)((ulong)*pBVar5 & 0x7fffffffffffffff);
  this->bc_emps_ = this->bc_emps_ + 1;
  pBVar4 = (blocks->super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar6 = *(int *)((long)&pBVar4->num_emps + (ulong)(uVar8 << 4)) + 1;
  *(int *)((long)&pBVar4->num_emps + (ulong)(uVar8 << 4)) = iVar6;
  if (iVar6 == 0x100 &&
      (int)((ulong)((long)(this->blocks_).
                          super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->blocks_).
                         super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>._M_impl
                         .super__Vector_impl_data._M_start) >> 4) - 1U == uVar8) {
    do {
      uVar8 = uVar8 - 1;
      pop_block_(this);
      if ((int)((ulong)((long)(this->blocks_).
                              super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->blocks_).
                             super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 4) == 0) {
        return;
      }
    } while ((blocks->super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar8].num_emps == 0x100);
  }
  return;
}

Assistant:

void unfix_(uint32_t node_pos, std::vector<BlockLink>& blocks) {
    assert(node_pos < bc_.size());
    assert(bc_[node_pos].is_fixed());

    auto block_pos = node_pos / BLOCK_SIZE;

    if (blocks[block_pos].num_emps == 0) {
      set_next_(node_pos, node_pos);
      set_prev_(node_pos, node_pos);
      blocks[block_pos].head = node_pos;
      insert_block_link_(block_pos, blocks);
    } else {
      auto head = blocks[block_pos].head;
      set_prev_(node_pos, prev_(head));
      set_next_(node_pos, head);
      set_next_(prev_(head), node_pos);
      set_prev_(head, node_pos);
    }

    bc_[node_pos].unfix();

    ++bc_emps_;
    ++blocks[block_pos].num_emps;

    if (block_pos == num_blocks() - 1) {
      while (blocks[block_pos].num_emps == BLOCK_SIZE) {
        pop_block_();
        if (num_blocks() == 0) {
          break;
        }
        --block_pos;
      }
    }
  }